

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_ClassArray<ON_3dmView>::Append(ON_ClassArray<ON_3dmView> *this,ON_3dmView *x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ON_3dmView temp;
  ON_3dmView local_610;
  
  uVar2 = this->m_count;
  uVar1 = this->m_capacity;
  if (uVar2 == uVar1) {
    if (((int)uVar2 < 8) || ((ulong)((long)(int)uVar2 * 0x5f0) < 0x10000001)) {
      uVar4 = 4;
      if (2 < (int)uVar2) {
        uVar4 = uVar2 * 2;
      }
    }
    else {
      uVar4 = 0x2b1e2;
      if ((int)uVar2 < 0x2b1e2) {
        uVar4 = uVar2;
      }
      uVar4 = uVar4 + uVar2;
    }
    if ((this->m_a != (ON_3dmView *)0x0) &&
       (iVar3 = (int)((ulong)((long)x - (long)this->m_a) >> 4), uVar2 = iVar3 * -0x2b1da461,
       (uVar1 != uVar2 && SBORROW4(uVar1,uVar2) == (int)(uVar1 + iVar3 * 0x2b1da461) < 0) &&
       -1 < (int)uVar2)) {
      ON_3dmView::ON_3dmView(&local_610);
      ON_3dmView::operator=(&local_610,x);
      if ((uint)this->m_capacity < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
      }
      if (this->m_a == (ON_3dmView *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                   ,0x6bc,"","allocation failure");
      }
      else {
        iVar3 = this->m_count;
        this->m_count = iVar3 + 1;
        ON_3dmView::operator=(this->m_a + iVar3,&local_610);
      }
      ON_3dmView::~ON_3dmView(&local_610);
      return;
    }
    if (uVar1 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (this->m_a == (ON_3dmView *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x6c6,"","allocation failure");
      return;
    }
  }
  iVar3 = this->m_count;
  this->m_count = iVar3 + 1;
  ON_3dmView::operator=(this->m_a + iVar3,x);
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}